

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall Assimp::ColladaLoader::ColladaLoader(ColladaLoader *this)

{
  ColladaLoader *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0104bde0;
  std::__cxx11::string::string((string *)&this->mFileName);
  memset(&this->mMeshIndexByID,0,0x30);
  std::
  map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
  ::map(&this->mMeshIndexByID);
  memset(&this->mMaterialIndexByName,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->mMaterialIndexByName);
  memset(&this->mMeshes,0,0x18);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->mMeshes);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(&this->mTargetMeshes);
  memset(&this->newMats,0,0x18);
  std::
  vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
  ::vector(&this->newMats);
  memset(&this->mCameras,0,0x18);
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::vector(&this->mCameras);
  memset(&this->mLights,0,0x18);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::vector(&this->mLights);
  memset(&this->mTextures,0,0x18);
  std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::vector(&this->mTextures);
  memset(&this->mAnims,0,0x18);
  std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::vector(&this->mAnims);
  this->noSkeletonMesh = false;
  this->ignoreUpDirection = false;
  this->useColladaName = false;
  this->mNodeNameCounter = 0;
  return;
}

Assistant:

ColladaLoader::ColladaLoader()
    : mFileName()
    , mMeshIndexByID()
    , mMaterialIndexByName()
    , mMeshes()
    , newMats()
    , mCameras()
    , mLights()
    , mTextures()
    , mAnims()
    , noSkeletonMesh(false)
    , ignoreUpDirection(false)
    , useColladaName(false)
    , mNodeNameCounter(0) {
    // empty
}